

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderNext(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  int iVar2;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  if (reader->doc == (xmlDocPtr)0x0) {
    pxVar1 = reader->node;
    if ((((pxVar1 != (xmlNodePtr)0x0) && (pxVar1->type == XML_ELEMENT_NODE)) &&
        (reader->state != XML_TEXTREADER_BACKTRACK)) &&
       ((reader->state != XML_TEXTREADER_END && ((pxVar1->extra & 1) == 0)))) {
      do {
        iVar2 = xmlTextReaderRead(reader);
        if (iVar2 != 1) {
          return iVar2;
        }
      } while (reader->node != pxVar1);
    }
    iVar2 = xmlTextReaderRead(reader);
    return iVar2;
  }
  iVar2 = xmlTextReaderNextTree(reader);
  return iVar2;
}

Assistant:

int
xmlTextReaderNext(xmlTextReaderPtr reader) {
    int ret;
    xmlNodePtr cur;

    if (reader == NULL)
	return(-1);
    if (reader->doc != NULL)
        return(xmlTextReaderNextTree(reader));
    cur = reader->node;
    if ((cur == NULL) || (cur->type != XML_ELEMENT_NODE))
        return(xmlTextReaderRead(reader));
    if (reader->state == XML_TEXTREADER_END || reader->state == XML_TEXTREADER_BACKTRACK)
        return(xmlTextReaderRead(reader));
    if (cur->extra & NODE_IS_EMPTY)
        return(xmlTextReaderRead(reader));
    do {
        ret = xmlTextReaderRead(reader);
	if (ret != 1)
	    return(ret);
    } while (reader->node != cur);
    return(xmlTextReaderRead(reader));
}